

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cc
# Opt level: O1

void google::protobuf::compiler::java::ExtensionGenerator::InitTemplateVars
               (FieldDescriptor *descriptor,string *scope,bool immutable,
               ClassNameResolver *name_resolver,
               flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *vars_pointer,Context *context)

{
  byte bVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  Type field_type;
  JavaType type;
  Nonnull<char_*> pcVar4;
  FieldDescriptor **ppFVar5;
  EnumDescriptor *descriptor_00;
  Descriptor *descriptor_01;
  Nonnull<const_char_*> pcVar6;
  Nonnull<const_char_*> extraout_RAX;
  bool bVar7;
  char *pcVar8;
  undefined7 in_register_00000011;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *field_00;
  anon_union_8_1_a8a14541_for_iterator_2 aVar9;
  AlphaNum *c;
  Context *options;
  string_view sVar10;
  string singular_type;
  anon_union_8_1_a8a14541_for_iterator_2 local_178;
  anon_union_8_1_a8a14541_for_iterator_2 local_170;
  size_t local_168 [4];
  uint local_148;
  uint local_144;
  slot_type *local_140;
  _Alloc_hider local_138;
  undefined1 local_130 [16];
  AlphaNum local_120;
  ClassNameResolver *local_f0;
  string local_e8;
  anon_union_8_1_a8a14541_for_iterator_2 local_c8;
  char *local_c0;
  undefined1 local_b8 [32];
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_98;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined2 local_38;
  
  local_144 = (uint)CONCAT71(in_register_00000011,immutable);
  options = context;
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[6]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_178,vars_pointer,(char (*) [6])0x13b590b);
  std::__cxx11::string::_M_assign((string *)((long)local_170.slot_ + 0x10));
  UnderscoresToCamelCaseCheckReserved_abi_cxx11_((string *)&local_178,(java *)descriptor,field);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[5]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)(local_130 + 0x10),vars_pointer,(char (*) [5])0x10f3c63);
  std::__cxx11::string::operator=
            ((string *)((long)local_120.piece_._M_str + 0x10),(string *)&local_178);
  if (local_178.slot_ != (slot_type *)local_168) {
    operator_delete(local_178.slot_,local_168[0] + 1);
  }
  local_148 = local_144 & 0xff;
  local_f0 = name_resolver;
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)&local_178,name_resolver,descriptor->containing_type_,(bool)(char)local_144);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[16]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)(local_130 + 0x10),vars_pointer,(char (*) [16])"containing_type");
  std::__cxx11::string::operator=
            ((string *)((long)local_120.piece_._M_str + 0x10),(string *)&local_178);
  if (local_178.slot_ != (slot_type *)local_168) {
    operator_delete(local_178.slot_,local_168[0] + 1);
  }
  pcVar4 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                     (descriptor->number_,(Nonnull<char_*>)local_168);
  local_178.slot_ = (slot_type *)(pcVar4 + -(long)local_168);
  _Var3._M_p = local_120.digits_;
  local_170.slot_ = (slot_type *)local_168;
  local_120.piece_._M_len = (size_t)_Var3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_130 + 0x10),(slot_type *)local_168,pcVar4);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[7]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_c8,vars_pointer,(char (*) [7])0x11a6d37);
  std::__cxx11::string::operator=((string *)(local_c0 + 0x10),(string *)(local_130 + 0x10));
  field_00 = extraout_RDX;
  if ((pointer)local_120.piece_._M_len != _Var3._M_p) {
    operator_delete((void *)local_120.piece_._M_len,local_120.digits_._0_8_ + 1);
    field_00 = extraout_RDX_00;
  }
  FieldConstantName_abi_cxx11_((string *)&local_178,(java *)descriptor,field_00);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[14]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)(local_130 + 0x10),vars_pointer,(char (*) [14])0x136f876);
  std::__cxx11::string::operator=
            ((string *)((long)local_120.piece_._M_str + 0x10),(string *)&local_178);
  if (local_178.slot_ != (slot_type *)local_168) {
    operator_delete(local_178.slot_,local_168[0] + 1);
  }
  if ((descriptor->field_0x1 & 8) == 0) {
    ppFVar5 = &descriptor->containing_type_->fields_;
  }
  else if ((descriptor->scope_).extension_scope == (Descriptor *)0x0) {
    ppFVar5 = &descriptor->file_->extensions_;
  }
  else {
    ppFVar5 = &((descriptor->scope_).extension_scope)->extensions_;
  }
  pcVar4 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                     ((int)((ulong)((long)descriptor - (long)*ppFVar5) >> 3) * -0x45d1745d,
                      (Nonnull<char_*>)local_168);
  local_178.slot_ = (slot_type *)(pcVar4 + -(long)local_168);
  local_170.slot_ = (slot_type *)local_168;
  local_120.piece_._M_len = (size_t)_Var3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_130 + 0x10),(slot_type *)local_168,pcVar4);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[6]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_c8,vars_pointer,(char (*) [6])0x1104a3a);
  std::__cxx11::string::operator=((string *)(local_c0 + 0x10),(string *)(local_130 + 0x10));
  if ((pointer)local_120.piece_._M_len != _Var3._M_p) {
    operator_delete((void *)local_120.piece_._M_len,local_120.digits_._0_8_ + 1);
  }
  bVar1 = descriptor->field_0x1;
  bVar7 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == bVar7) {
    pcVar6 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (bVar7,0xbf < bVar1,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar6 != (Nonnull<const_char_*>)0x0) {
    InitTemplateVars();
    pcVar6 = extraout_RAX;
    goto LAB_00eb11a5;
  }
  bVar1 = descriptor->field_0x1;
  if ((bVar1 & 0x20) == 0) {
    local_80[4] = (context->options_).opensource_runtime;
    local_80[5] = (context->options_).annotate_code;
    local_80[0] = (context->options_).generate_immutable_code;
    local_80[1] = (context->options_).generate_mutable_code;
    local_80[2] = (context->options_).generate_shared_code;
    local_80[3] = (context->options_).enforce_lite;
    local_78._M_p = (pointer)&local_68;
    pcVar2 = (context->options_).annotation_list_file._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar2,
               pcVar2 + (context->options_).annotation_list_file._M_string_length);
    local_58._M_p = (pointer)&local_48;
    pcVar2 = (context->options_).output_list_file._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar2,
               pcVar2 + (context->options_).output_list_file._M_string_length);
    local_38._0_1_ = (context->options_).strip_nonfunctional_codegen;
    local_38._1_1_ = (context->options_).jvm_dsl;
    DefaultValue_abi_cxx11_
              ((string *)&local_178,(java *)descriptor,(FieldDescriptor *)(ulong)local_148,
               SUB81(local_f0,0),(ClassNameResolver *)local_80,(Options *)options);
  }
  else {
    local_178.slot_ = (slot_type *)local_168;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,anon_var_dwarf_a12c75 + 5);
  }
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[8]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)(local_130 + 0x10),vars_pointer,(char (*) [8])0x1145dd2);
  std::__cxx11::string::operator=
            ((string *)((long)local_120.piece_._M_str + 0x10),(string *)&local_178);
  if (local_178.slot_ != (slot_type *)local_168) {
    operator_delete(local_178.slot_,local_168[0] + 1);
  }
  if ((bVar1 & 0x20) == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_p != &local_48) {
      operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
    }
  }
  field_type = GetType(descriptor);
  sVar10 = FieldTypeName(field_type);
  local_178.slot_ = (slot_type *)local_168;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_178,sVar10._M_str,sVar10._M_str + sVar10._M_len);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[14]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)(local_130 + 0x10),vars_pointer,(char (*) [14])"type_constant");
  std::__cxx11::string::operator=
            ((string *)((long)local_120.piece_._M_str + 0x10),(string *)&local_178);
  if (local_178.slot_ != (slot_type *)local_168) {
    operator_delete(local_178.slot_,local_168[0] + 1);
  }
  bVar7 = FieldDescriptor::is_packed(descriptor);
  pcVar8 = "optional_bool: false";
  if (bVar7) {
    pcVar8 = "Saw json_name: true";
  }
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[7]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_178,vars_pointer,(char (*) [7])0x1424704);
  std::__cxx11::string::_M_replace
            ((ulong)((long)local_170.slot_ + 0x10),0,*(char **)((long)local_170.slot_ + 0x18),
             (ulong)(pcVar8 + 0xf));
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[9]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_178,vars_pointer,(char (*) [9])"enum_map");
  std::__cxx11::string::_M_replace
            ((ulong)((long)local_170.slot_ + 0x10),0,*(char **)((long)local_170.slot_ + 0x18),
             0x133852d);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[10]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_178,vars_pointer,(char (*) [10])0x1132629);
  c = (AlphaNum *)&DAT_00000004;
  std::__cxx11::string::_M_replace
            ((ulong)((long)local_170.slot_ + 0x10),0,*(char **)((long)local_170.slot_ + 0x18),
             0x133852d);
  type = GetJavaType(descriptor);
  local_138._M_p = (pointer)0x0;
  local_130[0] = 0;
  local_140 = (slot_type *)local_130;
  switch(type) {
  case JAVATYPE_STRING:
    c = (AlphaNum *)&DAT_00000010;
    pcVar8 = "java.lang.String";
    break;
  case JAVATYPE_BYTES:
    pcVar8 = "byte[]";
    if ((char)local_144 != '\0') {
      pcVar8 = "com.google.protobuf.ByteString";
    }
    c = (AlphaNum *)&DAT_00000006;
    if ((char)local_144 != '\0') {
      c = (AlphaNum *)&DAT_0000001e;
    }
    break;
  case JAVATYPE_ENUM:
    descriptor_00 = FieldDescriptor::enum_type(descriptor);
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)&local_178,local_f0,descriptor_00,SUB41(local_148,0));
    std::__cxx11::string::operator=((string *)&local_140,(string *)&local_178);
    if (local_178.slot_ != (slot_type *)local_168) {
      operator_delete(local_178.slot_,local_168[0] + 1);
    }
    local_178.slot_ = (slot_type *)local_138._M_p;
    local_170.slot_ = local_140;
    local_120.piece_._M_len = (size_t)&DAT_00000016;
    local_120.piece_._M_str = ".internalGetValueMap()";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_c8,(lts_20250127 *)&local_178,(AlphaNum *)(local_130 + 0x10),
               (AlphaNum *)local_138._M_p);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[9]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_e8,vars_pointer,(char (*) [9])"enum_map");
    goto LAB_00eb0f60;
  case JAVATYPE_MESSAGE:
    descriptor_01 = FieldDescriptor::message_type(descriptor);
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)&local_178,local_f0,descriptor_01,SUB41(local_148,0));
    std::__cxx11::string::operator=((string *)&local_140,(string *)&local_178);
    if (local_178.slot_ != (slot_type *)local_168) {
      operator_delete(local_178.slot_,local_168[0] + 1);
    }
    local_178.slot_ = (slot_type *)local_138._M_p;
    local_170.slot_ = local_140;
    local_120.piece_._M_len = 0x15;
    local_120.piece_._M_str = ".getDefaultInstance()";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_c8,(lts_20250127 *)&local_178,(AlphaNum *)(local_130 + 0x10),
               (AlphaNum *)local_138._M_p);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[10]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_e8,vars_pointer,(char (*) [10])0x1132629);
LAB_00eb0f60:
    std::__cxx11::string::operator=
              ((string *)(local_e8._M_string_length + 0x10),(string *)&local_c8);
    local_168[0] = local_b8._0_8_;
    aVar9 = local_c8;
    if (local_c8.slot_ != (slot_type *)local_b8) {
LAB_00eb100d:
      operator_delete(aVar9.slot_,local_168[0] + 1);
    }
    goto LAB_00eb1015;
  default:
    sVar10 = BoxedPrimitiveTypeName(type);
    local_178.slot_ = (slot_type *)local_168;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_178,sVar10._M_str,sVar10._M_str + sVar10._M_len);
    std::__cxx11::string::operator=((string *)&local_140,(string *)&local_178);
    aVar9 = local_178;
    if (local_178.slot_ != (slot_type *)local_168) goto LAB_00eb100d;
    goto LAB_00eb1015;
  }
  std::__cxx11::string::_M_replace((ulong)&local_140,0,(char *)0x0,(ulong)pcVar8);
LAB_00eb1015:
  bVar1 = descriptor->field_0x1;
  bVar7 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == bVar7) {
    pcVar6 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (bVar7,0xbf < bVar1,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar6 == (Nonnull<const_char_*>)0x0) {
    if ((descriptor->field_0x1 & 0x20) == 0) {
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,local_140,local_138._M_p + (long)local_140);
    }
    else {
      local_178 = (anon_union_8_1_a8a14541_for_iterator_2)0xf;
      local_170.slot_ = (slot_type *)0x138c01f;
      local_120.piece_._M_len = (size_t)local_138._M_p;
      local_120.piece_._M_str = (char *)local_140;
      local_c8 = (anon_union_8_1_a8a14541_for_iterator_2)0x1;
      local_c0 = ">";
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_e8,(lts_20250127 *)&local_178,(AlphaNum *)(local_130 + 0x10),
                 (AlphaNum *)&local_c8,c);
    }
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[5]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)(local_b8 + 0x20),vars_pointer,(char (*) [5])0x1146303);
    std::__cxx11::string::operator=
              ((string *)((long)local_98.first.field_1 + 0x10),(string *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[14]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_178,vars_pointer,(char (*) [14])"singular_type");
    std::__cxx11::string::_M_assign((string *)((long)local_170.slot_ + 0x10));
    if (local_140 != (slot_type *)local_130) {
      operator_delete(local_140,CONCAT71(local_130._1_7_,local_130[0]) + 1);
    }
    return;
  }
LAB_00eb11a5:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)(local_b8 + 0x20),
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
             ,0xb54,pcVar6);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
            ((LogMessageFatal *)(local_b8 + 0x20));
}

Assistant:

void ExtensionGenerator::InitTemplateVars(
    const FieldDescriptor* descriptor, const std::string& scope, bool immutable,
    ClassNameResolver* name_resolver,
    absl::flat_hash_map<absl::string_view, std::string>* vars_pointer,
    Context* context) {
  absl::flat_hash_map<absl::string_view, std::string>& vars = *vars_pointer;
  vars["scope"] = scope;
  vars["name"] = UnderscoresToCamelCaseCheckReserved(descriptor);
  vars["containing_type"] =
      name_resolver->GetClassName(descriptor->containing_type(), immutable);
  vars["number"] = absl::StrCat(descriptor->number());
  vars["constant_name"] = FieldConstantName(descriptor);
  vars["index"] = absl::StrCat(descriptor->index());
  vars["default"] = descriptor->is_repeated()
                        ? ""
                        : DefaultValue(descriptor, immutable, name_resolver,
                                       context->options());
  vars["type_constant"] = std::string(FieldTypeName(GetType(descriptor)));
  vars["packed"] = descriptor->is_packed() ? "true" : "false";
  vars["enum_map"] = "null";
  vars["prototype"] = "null";

  JavaType java_type = GetJavaType(descriptor);
  std::string singular_type;
  switch (java_type) {
    case JAVATYPE_MESSAGE:
      singular_type =
          name_resolver->GetClassName(descriptor->message_type(), immutable);
      vars["prototype"] = absl::StrCat(singular_type, ".getDefaultInstance()");
      break;
    case JAVATYPE_ENUM:
      singular_type =
          name_resolver->GetClassName(descriptor->enum_type(), immutable);
      vars["enum_map"] = absl::StrCat(singular_type, ".internalGetValueMap()");
      break;
    case JAVATYPE_STRING:
      singular_type = "java.lang.String";
      break;
    case JAVATYPE_BYTES:
      singular_type = immutable ? "com.google.protobuf.ByteString" : "byte[]";
      break;
    default:
      singular_type = std::string(BoxedPrimitiveTypeName(java_type));
      break;
  }
  vars["type"] = descriptor->is_repeated()
                     ? absl::StrCat("java.util.List<", singular_type, ">")
                     : singular_type;
  vars["singular_type"] = singular_type;
}